

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
editor::GraphicDocument::remove_primitive_from_document
          (GraphicDocument *this,shared_ptr<editor::figures::CanvasPrimitive> *primitive)

{
  __normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>_*,_std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>_>
  __position;
  ostream *poVar1;
  string local_40 [32];
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<editor::figures::CanvasPrimitive>*,std::vector<std::shared_ptr<editor::figures::CanvasPrimitive>,std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<editor::figures::CanvasPrimitive>const>>
                         ((this->elements).
                          super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->elements).
                          super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,primitive);
  if (__position._M_current !=
      (this->elements).
      super__Vector_base<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<((ostream *)&std::cout,"removing primitive ");
    (**((primitive->super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr)->_vptr_CanvasPrimitive)(local_40);
    poVar1 = std::operator<<(poVar1,local_40);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_40);
    std::
    vector<std::shared_ptr<editor::figures::CanvasPrimitive>,_std::allocator<std::shared_ptr<editor::figures::CanvasPrimitive>_>_>
    ::erase(&this->elements,(const_iterator)__position._M_current);
  }
  return;
}

Assistant:

void GraphicDocument::remove_primitive_from_document(std::shared_ptr<figures::CanvasPrimitive>& primitive) {
        auto position = std::find(elements.begin(), elements.end(), primitive);
        if (position != elements.end()) {
            std::cout << "removing primitive " << primitive->get_representation() << "\n";
            elements.erase(position);
        }
    }